

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_cb0be::preprocessor<baryonyx::raw_problem>::try_affect_variable
          (preprocessor<baryonyx::raw_problem> *this)

{
  context *pcVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  const_reference pvVar5;
  __tuple_element_t<0UL,_tuple<int,_bool>_> *p_Var6;
  __tuple_element_t<1UL,_tuple<int,_bool>_> *p_Var7;
  const_reference pvVar8;
  reference pfVar9;
  function_element *elem_2;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range6_2;
  undefined1 local_90 [8];
  tuple<int,_bool> v_2;
  int e_2;
  int i_2;
  function_element *elem_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range6_1;
  undefined1 local_58 [8];
  tuple<int,_bool> v_1;
  int e_1;
  int i_1;
  function_element *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *__range6;
  undefined1 local_20 [8];
  tuple<int,_bool> v;
  int e;
  int i;
  preprocessor<baryonyx::raw_problem> *this_local;
  
  v.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  v.super__Tuple_impl<0UL,_int,_bool>._0_4_ =
       baryonyx::length<std::vector<int,std::allocator<int>>>(&this->equal_constraints);
  for (; v.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl !=
         v.super__Tuple_impl<0UL,_int,_bool>._0_4_;
      v.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl =
           v.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->equal_constraints,
                        (long)v.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>.
                              _M_head_impl);
    if (*pvVar4 == 1) {
      pcVar1 = this->ctx;
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&this->pb->equal_constraints,
                          (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                super__Head_base<0UL,_int,_false>._M_head_impl);
      baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                (pcVar1,"      - equal constraint {} will be removed.\n",&pvVar5->label);
      std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                (&this->pb->equal_constraints,
                 (long)v.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>.
                       _M_head_impl);
      reduce_equal_constraint((preprocessor<baryonyx::raw_problem> *)local_20,(constraint *)this);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->equal_constraints,
                          (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                super__Head_base<0UL,_int,_false>._M_head_impl);
      *pvVar4 = 0;
      p_Var6 = std::get<0ul,int,bool>((tuple<int,_bool> *)local_20);
      if (-1 < *p_Var6) {
        p_Var6 = std::get<0ul,int,bool>((tuple<int,_bool> *)local_20);
        iVar3 = *p_Var6;
        p_Var7 = std::get<1ul,int,bool>((tuple<int,_bool> *)local_20);
        pp_lifo::emplace(&this->lifo,iVar3,(bool)(*p_Var7 & 1));
      }
    }
    else {
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&this->pb->equal_constraints,
                          (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                super__Head_base<0UL,_int,_false>._M_head_impl);
      bVar2 = is_all_factor_ge_than_zero(pvVar5);
      if (bVar2) {
        pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                 operator[](&this->pb->equal_constraints,
                            (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                  super__Head_base<0UL,_int,_false>._M_head_impl);
        iVar3 = sum_factor(pvVar5);
        pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                 operator[](&this->pb->equal_constraints,
                            (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                  super__Head_base<0UL,_int,_false>._M_head_impl);
        if ((iVar3 == pvVar5->value) ||
           (pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                     operator[](&this->pb->equal_constraints,
                                (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                      super__Head_base<0UL,_int,_false>._M_head_impl),
           pvVar5->value == 0)) {
          pcVar1 = this->ctx;
          pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->equal_constraints,
                              (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          pvVar8 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->equal_constraints,
                              (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          __range6._7_1_ = pvVar8->value != 0;
          baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>,bool>
                    (pcVar1,
                     "      - equal constraint {} will be removed. Variables assigned to {}\n",
                     &pvVar5->label,(bool *)((long)&__range6 + 7));
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->equal_constraints,
                              (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          *pvVar4 = 0;
          pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->equal_constraints,
                              (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          __end0 = std::
                   vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                   begin(&pvVar5->elements);
          elem = (function_element *)
                 std::
                 vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                 end(&pvVar5->elements);
          while (bVar2 = __gnu_cxx::
                         operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                   (&__end0,(__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                             *)&elem), ((bVar2 ^ 0xffU) & 1) != 0) {
            pfVar9 = __gnu_cxx::
                     __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                     ::operator*(&__end0);
            iVar3 = pfVar9->variable_index;
            pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                     operator[](&this->pb->equal_constraints,
                                (long)v.super__Tuple_impl<0UL,_int,_bool>.
                                      super__Head_base<0UL,_int,_false>._M_head_impl);
            pp_lifo::emplace(&this->lifo,iVar3,pvVar5->value != 0);
            __gnu_cxx::
            __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
            ::operator++(&__end0);
          }
        }
      }
    }
  }
  v_1.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  v_1.super__Tuple_impl<0UL,_int,_bool>._0_4_ =
       baryonyx::length<std::vector<int,std::allocator<int>>>(&this->greater_constraints);
  for (; v_1.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl !=
         v_1.super__Tuple_impl<0UL,_int,_bool>._0_4_;
      v_1.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl =
           v_1.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl + 1)
  {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->greater_constraints,
                        (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                              super__Head_base<0UL,_int,_false>._M_head_impl);
    if (*pvVar4 == 1) {
      pcVar1 = this->ctx;
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&this->pb->greater_constraints,
                          (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                                super__Head_base<0UL,_int,_false>._M_head_impl);
      baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                (pcVar1,"      - greater constraint {} will be removed.\n",&pvVar5->label);
      std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                (&this->pb->greater_constraints,
                 (long)v_1.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>.
                       _M_head_impl);
      reduce_greater_constraint((preprocessor<baryonyx::raw_problem> *)local_58,(constraint *)this);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->greater_constraints,
                          (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                                super__Head_base<0UL,_int,_false>._M_head_impl);
      *pvVar4 = 0;
      p_Var6 = std::get<0ul,int,bool>((tuple<int,_bool> *)local_58);
      if (-1 < *p_Var6) {
        p_Var6 = std::get<0ul,int,bool>((tuple<int,_bool> *)local_58);
        iVar3 = *p_Var6;
        p_Var7 = std::get<1ul,int,bool>((tuple<int,_bool> *)local_58);
        pp_lifo::emplace(&this->lifo,iVar3,(bool)(*p_Var7 & 1));
      }
    }
    else {
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&this->pb->greater_constraints,
                          (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                                super__Head_base<0UL,_int,_false>._M_head_impl);
      bVar2 = is_all_factor_ge_than_zero(pvVar5);
      if (bVar2) {
        pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                 operator[](&this->pb->greater_constraints,
                            (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                                  super__Head_base<0UL,_int,_false>._M_head_impl);
        iVar3 = sum_factor(pvVar5);
        pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                 operator[](&this->pb->greater_constraints,
                            (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                                  super__Head_base<0UL,_int,_false>._M_head_impl);
        if (iVar3 == pvVar5->value) {
          pcVar1 = this->ctx;
          pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->greater_constraints,
                              (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          __range6_1._7_1_ = 1;
          baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>,bool>
                    (pcVar1,
                     "      - greater constraint {} will be removed. Variables assigned to {}\n",
                     &pvVar5->label,(bool *)((long)&__range6_1 + 7));
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->greater_constraints,
                              (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          *pvVar4 = 0;
          pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->greater_constraints,
                              (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          __end0_1 = std::
                     vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ::begin(&pvVar5->elements);
          elem_1 = (function_element *)
                   std::
                   vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                   end(&pvVar5->elements);
          while (bVar2 = __gnu_cxx::
                         operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                   (&__end0_1,
                                    (__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                     *)&elem_1), ((bVar2 ^ 0xffU) & 1) != 0) {
            pfVar9 = __gnu_cxx::
                     __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                     ::operator*(&__end0_1);
            pp_lifo::emplace(&this->lifo,pfVar9->variable_index,true);
            __gnu_cxx::
            __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
            ::operator++(&__end0_1);
          }
        }
        else {
          pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->greater_constraints,
                              (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          if (pvVar5->value == 0) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->greater_constraints,
                                (long)v_1.super__Tuple_impl<0UL,_int,_bool>.
                                      super__Head_base<0UL,_int,_false>._M_head_impl);
            *pvVar4 = 0;
          }
        }
      }
    }
  }
  v_2.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
  v_2.super__Tuple_impl<0UL,_int,_bool>._0_4_ =
       baryonyx::length<std::vector<int,std::allocator<int>>>(&this->less_constraints);
  for (; v_2.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl !=
         v_2.super__Tuple_impl<0UL,_int,_bool>._0_4_;
      v_2.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl =
           v_2.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>._M_head_impl + 1)
  {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->less_constraints,
                        (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                              super__Head_base<0UL,_int,_false>._M_head_impl);
    if (*pvVar4 == 1) {
      pcVar1 = this->ctx;
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&this->pb->less_constraints,
                          (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                                super__Head_base<0UL,_int,_false>._M_head_impl);
      baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                (pcVar1,"      - less constraint {} will be removed.\n",&pvVar5->label);
      std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                (&this->pb->less_constraints,
                 (long)v_2.super__Tuple_impl<0UL,_int,_bool>.super__Head_base<0UL,_int,_false>.
                       _M_head_impl);
      reduce_less_constraint((preprocessor<baryonyx::raw_problem> *)local_90,(constraint *)this);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->less_constraints,
                          (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                                super__Head_base<0UL,_int,_false>._M_head_impl);
      *pvVar4 = 0;
      p_Var6 = std::get<0ul,int,bool>((tuple<int,_bool> *)local_90);
      if (-1 < *p_Var6) {
        p_Var6 = std::get<0ul,int,bool>((tuple<int,_bool> *)local_90);
        iVar3 = *p_Var6;
        p_Var7 = std::get<1ul,int,bool>((tuple<int,_bool> *)local_90);
        pp_lifo::emplace(&this->lifo,iVar3,(bool)(*p_Var7 & 1));
      }
    }
    else {
      pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                         (&this->pb->less_constraints,
                          (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                                super__Head_base<0UL,_int,_false>._M_head_impl);
      bVar2 = is_all_factor_ge_than_zero(pvVar5);
      if (bVar2) {
        pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                 operator[](&this->pb->less_constraints,
                            (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                                  super__Head_base<0UL,_int,_false>._M_head_impl);
        if (pvVar5->value < 1) {
          pcVar1 = this->ctx;
          pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->less_constraints,
                              (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          __range6_2._7_1_ = 0;
          baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>,bool>
                    (pcVar1,"      - less constraint {} will be removed. Variables assigned to {}\n"
                     ,&pvVar5->label,(bool *)((long)&__range6_2 + 7));
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->less_constraints,
                              (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          *pvVar4 = 0;
          pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->less_constraints,
                              (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          __end0_2 = std::
                     vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ::begin(&pvVar5->elements);
          elem_2 = (function_element *)
                   std::
                   vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>::
                   end(&pvVar5->elements);
          while (bVar2 = __gnu_cxx::
                         operator==<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                   (&__end0_2,
                                    (__normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                                     *)&elem_2), ((bVar2 ^ 0xffU) & 1) != 0) {
            pfVar9 = __gnu_cxx::
                     __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
                     ::operator*(&__end0_2);
            pp_lifo::emplace(&this->lifo,pfVar9->variable_index,false);
            __gnu_cxx::
            __normal_iterator<const_baryonyx::function_element_*,_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>
            ::operator++(&__end0_2);
          }
        }
        else {
          pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->less_constraints,
                              (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          iVar3 = sum_factor(pvVar5);
          pvVar5 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->less_constraints,
                              (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                                    super__Head_base<0UL,_int,_false>._M_head_impl);
          if (iVar3 == pvVar5->value) {
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&this->less_constraints,
                                (long)v_2.super__Tuple_impl<0UL,_int,_bool>.
                                      super__Head_base<0UL,_int,_false>._M_head_impl);
            *pvVar4 = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void try_affect_variable()
    {
        for (int i = 0, e = bx::length(equal_constraints); i != e; ++i) {
            if (equal_constraints[i] == 1) {
                debug(ctx,
                      "      - equal constraint {} will be removed.\n",
                      pb.equal_constraints[i].label);

                auto v = reduce_equal_constraint(pb.equal_constraints[i]);
                equal_constraints[i] = 0;

                if (std::get<0>(v) >= 0)
                    lifo.emplace(std::get<0>(v), std::get<1>(v));
            } else {
                if (is_all_factor_ge_than_zero(pb.equal_constraints[i])) {
                    if (sum_factor(pb.equal_constraints[i]) ==
                          pb.equal_constraints[i].value ||
                        pb.equal_constraints[i].value == 0) {

                        debug(ctx,
                              "      - equal constraint {} will be removed. "
                              "Variables assigned to {}\n",
                              pb.equal_constraints[i].label,
                              pb.equal_constraints[i].value != 0);

                        equal_constraints[i] = 0;

                        for (const auto& elem :
                             pb.equal_constraints[i].elements)
                            lifo.emplace(elem.variable_index,
                                         pb.equal_constraints[i].value != 0);
                    }
                }
            }
        }

        for (int i = 0, e = bx::length(greater_constraints); i != e; ++i) {
            if (greater_constraints[i] == 1) {
                debug(ctx,
                      "      - greater constraint {} will be removed.\n",
                      pb.greater_constraints[i].label);

                auto v = reduce_greater_constraint(pb.greater_constraints[i]);
                greater_constraints[i] = 0;

                if (std::get<0>(v) >= 0)
                    lifo.emplace(std::get<0>(v), std::get<1>(v));
            } else {
                if (is_all_factor_ge_than_zero(pb.greater_constraints[i])) {
                    if (sum_factor(pb.greater_constraints[i]) ==
                        pb.greater_constraints[i].value) {

                        debug(ctx,
                              "      - greater constraint {} will be removed. "
                              "Variables assigned to {}\n",
                              pb.greater_constraints[i].label,
                              true);

                        greater_constraints[i] = 0;

                        for (const auto& elem :
                             pb.greater_constraints[i].elements)
                            lifo.emplace(elem.variable_index, true);

                    } else if (pb.greater_constraints[i].value == 0) {
                        greater_constraints[i] = 0;
                    }
                }
            }
        }

        for (int i = 0, e = bx::length(less_constraints); i != e; ++i) {
            if (less_constraints[i] == 1) {
                debug(ctx,
                      "      - less constraint {} will be removed.\n",
                      pb.less_constraints[i].label);

                auto v = reduce_less_constraint(pb.less_constraints[i]);
                less_constraints[i] = 0;

                if (std::get<0>(v) >= 0)
                    lifo.emplace(std::get<0>(v), std::get<1>(v));
            } else {
                if (is_all_factor_ge_than_zero(pb.less_constraints[i])) {
                    if (pb.less_constraints[i].value <= 0) {
                        debug(ctx,
                              "      - less constraint {} will be removed. "
                              "Variables assigned to {}\n",
                              pb.less_constraints[i].label,
                              false);

                        less_constraints[i] = 0;

                        for (const auto& elem :
                             pb.less_constraints[i].elements)
                            lifo.emplace(elem.variable_index, false);
                    } else if (sum_factor(pb.less_constraints[i]) ==
                               pb.less_constraints[i].value) {
                        less_constraints[i] = 0;
                    }
                }
            }
        }
    }